

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RECALL(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  short sVar2;
  player *ppVar3;
  _Bool _Var4;
  int16_t iVar5;
  uint32_t uVar6;
  char *pcVar7;
  wchar_t wVar8;
  wchar_t num_points;
  short sVar9;
  ulong uVar10;
  
  pcVar7 = strstr(world->name,"Dungeon");
  ppVar3 = player;
  sVar2 = player->home;
  sVar9 = player->place;
  context->ident = true;
  if ((((ppVar3->opts).opt[0x20] != true) || (ppVar3->total_winner != 0)) &&
     ((sVar9 != 0 || (cave->mon_cnt != 1)))) {
    if (sVar9 == sVar2) {
      if (ppVar3->recall_pt == 0 || sVar9 == 0) goto LAB_0013c1d3;
    }
    else if (sVar2 == 0) goto LAB_0013c1d3;
    if (ppVar3->upkeep->arena_level == false) {
      wVar8 = (uint)(pcVar7 == (char *)0x0) * 3 + L'\x01';
      num_points = L'\0';
      for (uVar10 = 0; (uint)wVar8 != uVar10; uVar10 = uVar10 + 1) {
        num_points = (num_points + L'\x01') - (uint)(ppVar3->recall[uVar10] == 0);
      }
      if (ppVar3->word_recall == 0) {
        wVar8 = get_recall_point(sVar9 != sVar2,num_points,wVar8);
        ppVar3 = player;
        if (wVar8 < L'\0') {
          return false;
        }
        if (sVar9 == sVar2) {
          sVar9 = player->recall[(uint)wVar8];
          if (sVar9 == 0) {
            return false;
          }
        }
        else {
          if ((world->levels[sVar9].locality & ~LOC_ERIADOR) == LOC_UNDERWORLD) {
            sVar9 = player->last_place;
          }
          if (sVar9 != 0 && wVar8 <= num_points) {
            player->recall[(uint)wVar8] = sVar9;
          }
        }
        ppVar3->recall_pt = sVar9;
        uVar6 = Rand_div(0x14);
        iVar5 = (short)uVar6 + 0xf;
        pcVar7 = "The air about you becomes charged...";
      }
      else {
        _Var4 = get_check("Word of Recall is already active.  Do you want to cancel it? ");
        iVar5 = 0;
        if (!_Var4) {
          return false;
        }
        pcVar7 = "A tension leaves the air around you...";
      }
      player->word_recall = iVar5;
      msg(pcVar7);
      ppVar3 = player;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x2000;
      handle_stuff(ppVar3);
      return true;
    }
  }
LAB_0013c1d3:
  msg("Nothing happens.");
  return true;
}

Assistant:

bool effect_handler_RECALL(effect_handler_context_t *context)
{
	//int target_place;
	int i, num_recall_points = 0;
	int num_poss = strstr(world->name, "Dungeon") ? 1 : 4;
	int point, current = player->place;
	bool inward = (current != player->home);
	context->ident = true;	

	/* No recall */
	if ((OPT(player, birth_no_recall) && !player->total_winner) ||
		((!current) && (cave->mon_cnt == 1)) ||
		((player->place == player->home) && !player->recall_pt) ||
		!player->home) {
		msg("Nothing happens.");
		return true;
	}

	/* No recall from quest levels with force_descend */
	//if (OPT(player, birth_force_descend) && (quest_forbid_downstairs(player->depth))) {
	//	msg("Nothing happens.");
	//	return true;
	//}

	/* No recall from single combat */
	if (player->upkeep->arena_level) {
		msg("Nothing happens.");
		return true;
	}

	/* Warn the player if they're descending to an unrecallable level */
	//target_place = player_get_next_place(player->max_depth, "down", 1);
	//if (OPT(player, birth_force_descend) && !(player->depth) &&
	//		(quest_forbid_downstairs(target_place))) {
	//	if (!get_check("Are you sure you want to descend? ")) {
	//		return false;
	//	}
	//}

	/* Find how many recall points currently exist */
	for (i = 0; i < num_poss; i++) {
		if (player->recall[i]) {
			num_recall_points++;
		}
	}

	/* Activate recall */
	if (!player->word_recall) {
		point = get_recall_point(inward, num_recall_points, num_poss);
		if (point >= 0) {
			if (inward) {
				int place = 0;

				/* Set the point, being careful about underworld etc */
				if ((world->levels[current].locality == LOC_UNDERWORLD) ||
					(world->levels[current].locality == LOC_MOUNTAIN_TOP)) {
					place = player->last_place;
				} else {
					place = current;
 				}

				/* Check for replacement */
				if ((point < num_recall_points + 1) && (place)) {
					player->recall[point] = place;
				}

				/* Set it */
				player->recall_pt = place;
 			} else {
				if (!player->recall[point]) {
					return false;
				}
				player->recall_pt = player->recall[point];
 			}
 		} else {
			return false;
 		}

		player->word_recall = randint0(20) + 15;
		msg("The air about you becomes charged...");
	} else {
		/* Deactivate recall */
		if (!get_check("Word of Recall is already active.  Do you want to cancel it? "))
			return false;

		player->word_recall = 0;
		msg("A tension leaves the air around you...");
	}

	/* Redraw status line */
	player->upkeep->redraw |= PR_STATUS;
	handle_stuff(player);

	return true;
}